

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqliteDeleteColumnNames(sqlite3 *db,Table *pTable)

{
  int iVar1;
  Column *pCVar2;
  
  pCVar2 = pTable->aCol;
  if (pCVar2 != (Column *)0x0) {
    if (0 < pTable->nCol) {
      iVar1 = 0;
      do {
        sqlite3DbFree(db,pCVar2->zName);
        sqlite3ExprDelete(db,pCVar2->pDflt);
        sqlite3DbFree(db,pCVar2->zDflt);
        sqlite3DbFree(db,pCVar2->zType);
        sqlite3DbFree(db,pCVar2->zColl);
        iVar1 = iVar1 + 1;
        pCVar2 = pCVar2 + 1;
      } while (iVar1 < pTable->nCol);
    }
    sqlite3DbFree(db,pTable->aCol);
    return;
  }
  return;
}

Assistant:

static void sqliteDeleteColumnNames(sqlite3 *db, Table *pTable){
  int i;
  Column *pCol;
  assert( pTable!=0 );
  if( (pCol = pTable->aCol)!=0 ){
    for(i=0; i<pTable->nCol; i++, pCol++){
      sqlite3DbFree(db, pCol->zName);
      sqlite3ExprDelete(db, pCol->pDflt);
      sqlite3DbFree(db, pCol->zDflt);
      sqlite3DbFree(db, pCol->zType);
      sqlite3DbFree(db, pCol->zColl);
    }
    sqlite3DbFree(db, pTable->aCol);
  }
}